

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O1

int erkStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  long lVar1;
  int iVar2;
  ARKodeERKStepMem in_RAX;
  ARKodeERKStepMem step_mem;
  ARKodeERKStepMem local_28;
  
  local_28 = in_RAX;
  iVar2 = erkStep_AccessStepMem(ark_mem,"erkStep_PrintAllStats",&local_28);
  if (iVar2 == 0) {
    lVar1 = local_28->nfe;
    if (fmt == SUN_OUTPUTFORMAT_TABLE) {
      iVar2 = 0;
      fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"RHS fn evals",lVar1);
    }
    else {
      fputc(0x2c,(FILE *)outfile);
      iVar2 = 0;
      fprintf((FILE *)outfile,"%s,%ld","RHS fn evals",lVar1);
    }
  }
  return iVar2;
}

Assistant:

int erkStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile, SUNOutputFormat fmt)
{
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  sunfprintf_long(outfile, fmt, SUNFALSE, "RHS fn evals", step_mem->nfe);

  return (ARK_SUCCESS);
}